

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

int cpu_ldsw_data_ra_aarch64(CPUArchState_conflict1 *env,target_ulong ptr,uintptr_t retaddr)

{
  int iVar1;
  
  iVar1 = cpu_ldsw_mmuidx_ra_aarch64(env,ptr,*(byte *)((long)&env->hflags + 3) & 0xf,retaddr);
  return iVar1;
}

Assistant:

int cpu_ldsw_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldsw_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}